

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
DoSetSuperProperty_NoFastPath<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  ushort uVar1;
  bool bVar2;
  PropertyId propertyId;
  InlineCache *inlineCache_00;
  FunctionBody *functionBody;
  Var newValue;
  Var thisInstance;
  ScriptFunction *this_00;
  ConstructorCache *this_01;
  ScriptContext *this_02;
  ThreadContext *threadContext;
  InlineCache *inlineCache;
  PropertyOperationFlags flags_local;
  Var instance_local;
  OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
  inlineCache_00 = GetInlineCache(this,(uint)playout->PropertyIdIndex);
  functionBody = GetFunctionBody(this);
  uVar1 = playout->PropertyIdIndex;
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->PropertyIdIndex);
  newValue = GetReg<unsigned_short>(this,playout->Value);
  thisInstance = GetReg<unsigned_short>(this,playout->Value2);
  Js::JavascriptOperators::PatchPutValueWithThisPtrNoLocalFastPath<false,Js::InlineCache>
            (functionBody,inlineCache_00,(uint)uVar1,instance,propertyId,newValue,thisInstance,flags
            );
  bVar2 = TaggedNumber::Is(instance);
  if (!bVar2) {
    this_00 = GetJavascriptFunction(this);
    this_01 = JavascriptFunction::GetConstructorCache((JavascriptFunction *)this_00);
    bVar2 = ConstructorCache::NeedsUpdateAfterCtor(this_01);
    if (bVar2) {
      this_02 = GetScriptContext(this);
      threadContext = ScriptContext::GetThreadContext(this_02);
      InlineCache::RemoveFromInvalidationListAndClear(inlineCache_00,threadContext);
    }
  }
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoSetSuperProperty_NoFastPath(unaligned T* playout, Var instance, PropertyOperationFlags flags)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        InlineCache *const inlineCache = GetInlineCache(playout->PropertyIdIndex);

        JavascriptOperators::PatchPutValueWithThisPtrNoLocalFastPath<false, InlineCache>(
            GetFunctionBody(),
            inlineCache,
            playout->PropertyIdIndex,
            instance,
            GetPropertyIdFromCacheId(playout->PropertyIdIndex),
            GetReg(playout->Value),
            GetReg(playout->Value2),
            flags);

        if (!TaggedNumber::Is(instance) && GetJavascriptFunction()->GetConstructorCache()->NeedsUpdateAfterCtor())
        {
            // This function has only 'this' statements and is being used as a constructor. When the constructor exits, the
            // function object's constructor cache will be updated with the type produced by the constructor. From that
            // point on, when the same function object is used as a constructor, the a new object with the final type will
            // be created. Whatever is stored in the inline cache currently will cause cache misses after the constructor
            // cache update. So, just clear it now so that the caches won't be flagged as polymorphic.
            inlineCache->RemoveFromInvalidationListAndClear(this->GetScriptContext()->GetThreadContext());
        }
    }